

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ElseConstraintClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElseConstraintClauseSyntax,slang::syntax::ElseConstraintClauseSyntax_const&>
          (BumpAllocator *this,ElseConstraintClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ConstraintItemSyntax *pCVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ElseConstraintClauseSyntax *pEVar10;
  
  pEVar10 = (ElseConstraintClauseSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->elseKeyword).kind;
  uVar7 = (args->elseKeyword).field_0x2;
  NVar8.raw = (args->elseKeyword).numFlags.raw;
  uVar9 = (args->elseKeyword).rawLen;
  pIVar3 = (args->elseKeyword).info;
  pCVar4 = (args->constraints).ptr;
  (pEVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pEVar10->super_SyntaxNode).field_0x4 = uVar5;
  (pEVar10->super_SyntaxNode).parent = pSVar1;
  (pEVar10->super_SyntaxNode).previewNode = pSVar2;
  (pEVar10->elseKeyword).kind = TVar6;
  (pEVar10->elseKeyword).field_0x2 = uVar7;
  (pEVar10->elseKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pEVar10->elseKeyword).rawLen = uVar9;
  (pEVar10->elseKeyword).info = pIVar3;
  (pEVar10->constraints).ptr = pCVar4;
  return pEVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }